

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O2

int PARMCI_Init_mpi_comm(MPI_Comm comm)

{
  int iVar1;
  int iVar2;
  
  iVar1 = comex_init_comm(comm);
  iVar2 = 0;
  if (iVar1 == 0) {
    iVar1 = comex_group_comm(0,&ARMCI_COMM_WORLD);
    if (iVar1 != 0) {
      __assert_fail("COMEX_SUCCESS == rc",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                    ,0x1b0,"int PARMCI_Init_mpi_comm(MPI_Comm)");
    }
    ARMCI_Default_Proc_Group = 0;
    armci_init_domains(ARMCI_COMM_WORLD);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int PARMCI_Init_mpi_comm(MPI_Comm comm)
{
    int ret = comex_init_comm(comm);
    if (ret == COMEX_SUCCESS) {
      int rc = comex_group_comm(COMEX_GROUP_WORLD, &ARMCI_COMM_WORLD);
      assert(COMEX_SUCCESS == rc);
      ARMCI_Default_Proc_Group = 0;
      armci_init_domains(ARMCI_COMM_WORLD);
      ret = 1;
    } else {
      ret = 0;
    }
    return ret;
}